

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O0

bool __thiscall hwtest::pgraph::MthdEmuEmuD3D0TexFormat::is_valid_val(MthdEmuEmuD3D0TexFormat *this)

{
  uint uVar1;
  uint uVar2;
  int min_l;
  int max_l;
  MthdEmuEmuD3D0TexFormat *this_local;
  
  if (((this->super_SingleMthdTest).super_MthdTest.val & 0xce0000) == 0) {
    uVar2 = (this->super_SingleMthdTest).super_MthdTest.val >> 0x1c;
    uVar1 = (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x24) >> 0x3c);
    if (uVar1 < 2) {
      this_local._7_1_ = false;
    }
    else if (uVar2 < uVar1) {
      this_local._7_1_ = false;
    }
    else if (uVar2 < 0xc) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool is_valid_val() override {
		if (val & ~0xff31ffff)
			return false;
		int max_l = extr(val, 28, 4);
		int min_l = extr(val, 24, 4);
		if (min_l < 2)
			return false;
		if (min_l > max_l)
			return false;
		if (max_l > 0xb)
			return false;
		return true;
	}